

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_cavlc.c
# Opt level: O0

int h264_level(bitstream *str,int suffixLength,int onebias,int32_t *val)

{
  int iVar1;
  uint32_t local_3c;
  uint local_38;
  uint32_t tmp;
  uint32_t level_suffix;
  int level_prefix;
  int level_code;
  int suffix_size;
  int32_t *val_local;
  int onebias_local;
  int suffixLength_local;
  bitstream *str_local;
  
  _level_code = val;
  val_local._0_4_ = onebias;
  val_local._4_4_ = suffixLength;
  _onebias_local = str;
  if (str->dir == VS_ENCODE) {
    if (*val < 0) {
      level_suffix = -(*val * 2 + 1);
    }
    else {
      level_suffix = *val * 2 - 2;
    }
    if (onebias != 0) {
      level_suffix = level_suffix - 2;
    }
    tmp = 0;
    local_38 = level_suffix;
    do {
      level_prefix = val_local._4_4_;
      if ((tmp == 0xe) && (val_local._4_4_ == 0)) {
        level_prefix = 4;
      }
      if (0xe < (int)tmp) {
        level_prefix = tmp - 3;
      }
      if (local_38 < (uint)(1 << ((byte)level_prefix & 0x1f))) {
        local_3c = 1;
        iVar1 = vs_u(_onebias_local,&local_3c,1);
        if (iVar1 != 0) {
          return 1;
        }
        if ((level_prefix != 0) && (iVar1 = vs_u(_onebias_local,&local_38,level_prefix), iVar1 != 0)
           ) {
          return 1;
        }
        goto LAB_00112280;
      }
      local_38 = local_38 - (1 << ((byte)level_prefix & 0x1f));
      tmp = tmp + 1;
      local_3c = 0;
      iVar1 = vs_u(_onebias_local,&local_3c,1);
    } while (iVar1 == 0);
    str_local._4_4_ = 1;
  }
  else {
    level_suffix = 0;
    tmp = 0;
    while( true ) {
      level_prefix = val_local._4_4_;
      if ((tmp == 0xe) && (val_local._4_4_ == 0)) {
        level_prefix = 4;
      }
      if (0xe < (int)tmp) {
        level_prefix = tmp - 3;
      }
      iVar1 = vs_u(_onebias_local,&local_3c,1);
      if (iVar1 != 0) {
        return 1;
      }
      if (local_3c != 0) break;
      level_suffix = (1 << ((byte)level_prefix & 0x1f)) + level_suffix;
      tmp = tmp + 1;
    }
    if (level_prefix != 0) {
      iVar1 = vs_u(_onebias_local,&local_38,level_prefix);
      if (iVar1 != 0) {
        return 1;
      }
      level_suffix = local_38 + level_suffix;
    }
    if ((int)val_local != 0) {
      level_suffix = level_suffix + 2;
    }
    if ((level_suffix & 1) == 0) {
      *_level_code = (int)(level_suffix + 2) >> 1;
    }
    else {
      *_level_code = (int)(-1 - level_suffix) >> 1;
    }
LAB_00112280:
    str_local._4_4_ = 0;
  }
  return str_local._4_4_;
}

Assistant:

int h264_level(struct bitstream *str, int suffixLength, int onebias, int32_t *val) {
	/*
	 * each level_prefix takes 1 << suffix_size consecutive level_codes from the code space
	 * level_prefix 0..13:
	 *   suffix size = suffixLength
	 * level prefix 14:
	 *   suffix size = suffixLength ? suffixLength : 4
	 * level prefix 15+:
	 *   suffix size = level_prefix - 3 [thus 12+]
	 */
	int suffix_size;
	int level_code;
	int level_prefix;
	uint32_t level_suffix;
	uint32_t tmp;
	if (str->dir == VS_ENCODE) {
		if (*val < 0)
			level_code = -((*val << 1) + 1);
		else
			level_code = ((*val << 1) - 2);
		if (onebias)
			level_code -= 2;

		level_prefix = 0;
		level_suffix = level_code;
		while (1) {
			suffix_size = suffixLength;
			if (level_prefix == 14 && !suffix_size)
				suffix_size = 4;
			if (level_prefix >= 15)
				suffix_size = level_prefix - 3;
			if (level_suffix < (1 << suffix_size))
				break;
			level_suffix -= (1 << suffix_size);
			level_prefix++;
			tmp = 0;
			if (vs_u(str, &tmp, 1)) return 1;
		}
		tmp = 1;
		if (vs_u(str, &tmp, 1)) return 1;
		if (suffix_size)
			if (vs_u(str, &level_suffix, suffix_size)) return 1;
	} else {
		level_code = 0;
		level_prefix = 0;
		while (1) {
			suffix_size = suffixLength;
			if (level_prefix == 14 && !suffix_size)
				suffix_size = 4;
			if (level_prefix >= 15)
				suffix_size = level_prefix - 3;
			if (vs_u(str, &tmp, 1)) return 1;
			if (tmp)
				break;
			level_code += (1 << suffix_size);
			level_prefix++;
		}
		if (suffix_size) {
			if (vs_u(str, &level_suffix, suffix_size)) return 1;
			level_code += level_suffix;
		}

		if (onebias)
			level_code += 2;
		if (level_code & 1)
			*val = (-level_code - 1) >> 1;
		else
			*val = (level_code + 2) >> 1;
	}
	return 0;
}